

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O2

void __thiscall
UtestShell::assertBitsEqual
          (UtestShell *this,unsigned_long expected,unsigned_long actual,unsigned_long mask,
          size_t byteCount,char *text,char *fileName,size_t lineNumber,
          TestTerminator *testTerminator)

{
  TestResult *pTVar1;
  SimpleString local_a8;
  TestFailure local_98;
  
  pTVar1 = getTestResult(this);
  (*pTVar1->_vptr_TestResult[10])(pTVar1);
  if (((actual ^ expected) & mask) != 0) {
    SimpleString::SimpleString(&local_a8,text);
    BitsEqualFailure::BitsEqualFailure
              ((BitsEqualFailure *)&local_98,this,fileName,lineNumber,expected,actual,mask,byteCount
               ,&local_a8);
    (*this->_vptr_UtestShell[0x27])(this,&local_98,testTerminator);
    TestFailure::~TestFailure(&local_98);
    SimpleString::~SimpleString(&local_a8);
  }
  return;
}

Assistant:

void UtestShell::assertBitsEqual(unsigned long expected, unsigned long actual, unsigned long mask, size_t byteCount, const char* text, const char *fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if ((expected & mask) != (actual & mask))
        failWith(BitsEqualFailure(this, fileName, lineNumber, expected, actual, mask, byteCount, text), testTerminator);
}